

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmbtoken.cc
# Opt level: O3

int dleq_verify(PMBTOKEN_METHOD *method,CBS *cbs,TRUST_TOKEN_CLIENT_KEY *pub,EC_JACOBIAN *T,
               EC_JACOBIAN *S,EC_JACOBIAN *W,EC_JACOBIAN *Ws)

{
  EC_JACOBIAN *__src;
  EC_GROUP *group;
  int iVar1;
  long lVar2;
  EC_SCALAR *pEVar3;
  EC_SCALAR *pEVar4;
  BN_ULONG *pBVar5;
  int line;
  EC_JACOBIAN *__src_00;
  byte bVar6;
  EC_SCALAR calculated;
  BN_ULONG local_1510 [9];
  BN_ULONG local_14c8 [10];
  EC_SCALAR minus_c1;
  EC_SCALAR v1;
  EC_SCALAR v0;
  EC_SCALAR u1;
  EC_SCALAR u0;
  EC_SCALAR c1;
  EC_SCALAR c0;
  EC_SCALAR minus_cs;
  EC_SCALAR vs;
  EC_SCALAR us;
  EC_SCALAR cs;
  EC_SCALAR minus_c0;
  EC_AFFINE affines [10];
  EC_SCALAR c;
  EC_JACOBIAN pub1;
  EC_JACOBIAN jacobians [10];
  EC_JACOBIAN pub0;
  EC_JACOBIAN pubs;
  
  bVar6 = 0;
  group = method->group;
  iVar1 = scalar_from_cbs(cbs,group,&cs);
  if (((iVar1 == 0) || (iVar1 = scalar_from_cbs(cbs,group,&us), iVar1 == 0)) ||
     (iVar1 = scalar_from_cbs(cbs,group,&vs), iVar1 == 0)) {
    iVar1 = 0x69;
    line = 0x2ba;
  }
  else {
    __src = &(group->generator).raw;
    ec_affine_to_jacobian(group,&pubs,&pub->pubs);
    ec_scalar_neg(group,&minus_cs,&cs);
    __src_00 = &method->h;
    memcpy((EC_JACOBIAN *)affines,__src,0xd8);
    memcpy(&affines[1].Y,__src_00,0xd8);
    memcpy(affines + 3,&pubs,0xd8);
    pEVar3 = &us;
    pEVar4 = &calculated;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      pEVar4->words[0] = pEVar3->words[0];
      pEVar3 = (EC_SCALAR *)((long)pEVar3 + ((ulong)bVar6 * -2 + 1) * 8);
      pEVar4 = (EC_SCALAR *)((long)pEVar4 + ((ulong)bVar6 * -2 + 1) * 8);
    }
    pEVar3 = &vs;
    pBVar5 = local_1510;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      *pBVar5 = pEVar3->words[0];
      pEVar3 = (EC_SCALAR *)((long)pEVar3 + ((ulong)bVar6 * -2 + 1) * 8);
      pBVar5 = pBVar5 + (ulong)bVar6 * -2 + 1;
    }
    pEVar3 = &minus_cs;
    pBVar5 = local_14c8;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      *pBVar5 = pEVar3->words[0];
      pEVar3 = (EC_SCALAR *)((long)pEVar3 + ((ulong)bVar6 * -2 + 1) * 8);
      pBVar5 = pBVar5 + (ulong)bVar6 * -2 + 1;
    }
    iVar1 = ec_point_mul_scalar_public_batch
                      (group,jacobians + 4,(EC_SCALAR *)0x0,(EC_JACOBIAN *)affines,&calculated,3);
    if (iVar1 == 0) {
      return 0;
    }
    memcpy((EC_JACOBIAN *)affines,T,0xd8);
    memcpy(&affines[1].Y,S,0xd8);
    memcpy(affines + 3,Ws,0xd8);
    pEVar3 = &us;
    pEVar4 = &calculated;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      pEVar4->words[0] = pEVar3->words[0];
      pEVar3 = (EC_SCALAR *)((long)pEVar3 + ((ulong)bVar6 * -2 + 1) * 8);
      pEVar4 = (EC_SCALAR *)((long)pEVar4 + ((ulong)bVar6 * -2 + 1) * 8);
    }
    pEVar3 = &vs;
    pBVar5 = local_1510;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      *pBVar5 = pEVar3->words[0];
      pEVar3 = (EC_SCALAR *)((long)pEVar3 + ((ulong)bVar6 * -2 + 1) * 8);
      pBVar5 = pBVar5 + (ulong)bVar6 * -2 + 1;
    }
    pEVar3 = &minus_cs;
    pBVar5 = local_14c8;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      *pBVar5 = pEVar3->words[0];
      pEVar3 = (EC_SCALAR *)((long)pEVar3 + ((ulong)bVar6 * -2 + 1) * 8);
      pBVar5 = pBVar5 + (ulong)bVar6 * -2 + 1;
    }
    iVar1 = ec_point_mul_scalar_public_batch
                      (group,jacobians + 5,(EC_SCALAR *)0x0,(EC_JACOBIAN *)affines,&calculated,3);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = scalar_from_cbs(cbs,group,&c0);
    if ((((iVar1 == 0) || (iVar1 = scalar_from_cbs(cbs,group,&c1), iVar1 == 0)) ||
        ((iVar1 = scalar_from_cbs(cbs,group,&u0), iVar1 == 0 ||
         ((iVar1 = scalar_from_cbs(cbs,group,&u1), iVar1 == 0 ||
          (iVar1 = scalar_from_cbs(cbs,group,&v0), iVar1 == 0)))))) ||
       (iVar1 = scalar_from_cbs(cbs,group,&v1), iVar1 == 0)) {
      iVar1 = 0x69;
      line = 0x2cf;
    }
    else {
      ec_affine_to_jacobian(group,&pub0,&pub->pub0);
      ec_affine_to_jacobian(group,&pub1,&pub->pub1);
      ec_scalar_neg(group,&minus_c0,&c0);
      ec_scalar_neg(group,&minus_c1,&c1);
      memcpy((EC_JACOBIAN *)affines,__src,0xd8);
      memcpy(&affines[1].Y,__src_00,0xd8);
      memcpy(affines + 3,&pub0,0xd8);
      pEVar3 = &u0;
      pEVar4 = &calculated;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        pEVar4->words[0] = pEVar3->words[0];
        pEVar3 = (EC_SCALAR *)((long)pEVar3 + ((ulong)bVar6 * -2 + 1) * 8);
        pEVar4 = (EC_SCALAR *)((long)pEVar4 + ((ulong)bVar6 * -2 + 1) * 8);
      }
      pEVar3 = &v0;
      pBVar5 = local_1510;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        *pBVar5 = pEVar3->words[0];
        pEVar3 = (EC_SCALAR *)((long)pEVar3 + ((ulong)bVar6 * -2 + 1) * 8);
        pBVar5 = pBVar5 + (ulong)bVar6 * -2 + 1;
      }
      pEVar3 = &minus_c0;
      pBVar5 = local_14c8;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        *pBVar5 = pEVar3->words[0];
        pEVar3 = (EC_SCALAR *)((long)pEVar3 + ((ulong)bVar6 * -2 + 1) * 8);
        pBVar5 = pBVar5 + (ulong)bVar6 * -2 + 1;
      }
      iVar1 = ec_point_mul_scalar_public_batch
                        (group,jacobians + 6,(EC_SCALAR *)0x0,(EC_JACOBIAN *)affines,&calculated,3);
      if (iVar1 == 0) {
        return 0;
      }
      memcpy((EC_JACOBIAN *)affines,T,0xd8);
      memcpy(&affines[1].Y,S,0xd8);
      memcpy(affines + 3,W,0xd8);
      pEVar3 = &u0;
      pEVar4 = &calculated;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        pEVar4->words[0] = pEVar3->words[0];
        pEVar3 = (EC_SCALAR *)((long)pEVar3 + ((ulong)bVar6 * -2 + 1) * 8);
        pEVar4 = (EC_SCALAR *)((long)pEVar4 + ((ulong)bVar6 * -2 + 1) * 8);
      }
      pEVar3 = &v0;
      pBVar5 = local_1510;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        *pBVar5 = pEVar3->words[0];
        pEVar3 = (EC_SCALAR *)((long)pEVar3 + ((ulong)bVar6 * -2 + 1) * 8);
        pBVar5 = pBVar5 + (ulong)bVar6 * -2 + 1;
      }
      pEVar3 = &minus_c0;
      pBVar5 = local_14c8;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        *pBVar5 = pEVar3->words[0];
        pEVar3 = (EC_SCALAR *)((long)pEVar3 + ((ulong)bVar6 * -2 + 1) * 8);
        pBVar5 = pBVar5 + (ulong)bVar6 * -2 + 1;
      }
      iVar1 = ec_point_mul_scalar_public_batch
                        (group,jacobians + 7,(EC_SCALAR *)0x0,(EC_JACOBIAN *)affines,&calculated,3);
      if (iVar1 == 0) {
        return 0;
      }
      memcpy((EC_JACOBIAN *)affines,__src,0xd8);
      memcpy(&affines[1].Y,__src_00,0xd8);
      memcpy(affines + 3,&pub1,0xd8);
      pEVar3 = &u1;
      pEVar4 = &calculated;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        pEVar4->words[0] = pEVar3->words[0];
        pEVar3 = (EC_SCALAR *)((long)pEVar3 + ((ulong)bVar6 * -2 + 1) * 8);
        pEVar4 = (EC_SCALAR *)((long)pEVar4 + ((ulong)bVar6 * -2 + 1) * 8);
      }
      pEVar3 = &v1;
      pBVar5 = local_1510;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        *pBVar5 = pEVar3->words[0];
        pEVar3 = (EC_SCALAR *)((long)pEVar3 + ((ulong)bVar6 * -2 + 1) * 8);
        pBVar5 = pBVar5 + (ulong)bVar6 * -2 + 1;
      }
      pEVar3 = &minus_c1;
      pBVar5 = local_14c8;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        *pBVar5 = pEVar3->words[0];
        pEVar3 = (EC_SCALAR *)((long)pEVar3 + ((ulong)bVar6 * -2 + 1) * 8);
        pBVar5 = pBVar5 + (ulong)bVar6 * -2 + 1;
      }
      iVar1 = ec_point_mul_scalar_public_batch
                        (group,jacobians + 8,(EC_SCALAR *)0x0,(EC_JACOBIAN *)affines,&calculated,3);
      if (iVar1 == 0) {
        return 0;
      }
      memcpy((EC_JACOBIAN *)affines,T,0xd8);
      memcpy(&affines[1].Y,S,0xd8);
      memcpy(affines + 3,W,0xd8);
      pEVar3 = &u1;
      pEVar4 = &calculated;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        pEVar4->words[0] = pEVar3->words[0];
        pEVar3 = (EC_SCALAR *)((long)pEVar3 + ((ulong)bVar6 * -2 + 1) * 8);
        pEVar4 = (EC_SCALAR *)((long)pEVar4 + ((ulong)bVar6 * -2 + 1) * 8);
      }
      pEVar3 = &v1;
      pBVar5 = local_1510;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        *pBVar5 = pEVar3->words[0];
        pEVar3 = (EC_SCALAR *)((long)pEVar3 + ((ulong)bVar6 * -2 + 1) * 8);
        pBVar5 = pBVar5 + (ulong)bVar6 * -2 + 1;
      }
      pEVar3 = &minus_c1;
      pBVar5 = local_14c8;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        *pBVar5 = pEVar3->words[0];
        pEVar3 = (EC_SCALAR *)((long)pEVar3 + ((ulong)bVar6 * -2 + 1) * 8);
        pBVar5 = pBVar5 + (ulong)bVar6 * -2 + 1;
      }
      iVar1 = ec_point_mul_scalar_public_batch
                        (group,jacobians + 9,(EC_SCALAR *)0x0,(EC_JACOBIAN *)affines,&calculated,3);
      if (iVar1 == 0) {
        return 0;
      }
      memcpy(jacobians,T,0xd8);
      memcpy(jacobians + 1,S,0xd8);
      memcpy(jacobians + 2,W,0xd8);
      memcpy(jacobians + 3,Ws,0xd8);
      iVar1 = ec_jacobian_to_affine_batch(group,affines,jacobians,10);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = hash_c_dleq(method,&calculated,&pub->pubs,affines,affines + 1,affines + 3,affines + 4,
                          affines + 5);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = ec_scalar_equal_vartime(group,&cs,&calculated);
      if (iVar1 == 0) {
        iVar1 = 0x72;
        line = 0x2f7;
      }
      else {
        iVar1 = hash_c_dleqor(method,&calculated,&pub->pub0,&pub->pub1,affines,affines + 1,
                              affines + 2,affines + 6,affines + 7,affines + 8,affines + 9);
        if (iVar1 == 0) {
          return 0;
        }
        ec_scalar_add(group,&c,&c0,&c1);
        iVar1 = ec_scalar_equal_vartime(group,&c,&calculated);
        if (iVar1 != 0) {
          return 1;
        }
        iVar1 = 0x72;
        line = 0x307;
      }
    }
  }
  ERR_put_error(0x20,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/pmbtoken.cc"
                ,line);
  return 0;
}

Assistant:

static int dleq_verify(const PMBTOKEN_METHOD *method, CBS *cbs,
                       const TRUST_TOKEN_CLIENT_KEY *pub, const EC_JACOBIAN *T,
                       const EC_JACOBIAN *S, const EC_JACOBIAN *W,
                       const EC_JACOBIAN *Ws) {
  const EC_GROUP *group = method->group;
  const EC_JACOBIAN *g = &group->generator.raw;

  // We verify a DLEQ proof for the validity token and a DLEQOR2 proof for the
  // private metadata token. To allow amortizing Jacobian-to-affine conversions,
  // we compute Ki for both proofs first. Additionally, all inputs to this
  // function are public, so we can use the faster variable-time
  // multiplications.
  enum {
    idx_T,
    idx_S,
    idx_W,
    idx_Ws,
    idx_Ks0,
    idx_Ks1,
    idx_K00,
    idx_K01,
    idx_K10,
    idx_K11,
    num_idx,
  };
  EC_JACOBIAN jacobians[num_idx];

  // Decode the DLEQ proof.
  EC_SCALAR cs, us, vs;
  if (!scalar_from_cbs(cbs, group, &cs) || !scalar_from_cbs(cbs, group, &us) ||
      !scalar_from_cbs(cbs, group, &vs)) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_DECODE_FAILURE);
    return 0;
  }

  // Ks = us*(G;T) + vs*(H;S) - cs*(pubs;Ws)
  EC_JACOBIAN pubs;
  ec_affine_to_jacobian(group, &pubs, &pub->pubs);
  EC_SCALAR minus_cs;
  ec_scalar_neg(group, &minus_cs, &cs);
  if (!mul_public_3(group, &jacobians[idx_Ks0], g, &us, &method->h, &vs, &pubs,
                    &minus_cs) ||
      !mul_public_3(group, &jacobians[idx_Ks1], T, &us, S, &vs, Ws,
                    &minus_cs)) {
    return 0;
  }

  // Decode the DLEQOR proof.
  EC_SCALAR c0, c1, u0, u1, v0, v1;
  if (!scalar_from_cbs(cbs, group, &c0) || !scalar_from_cbs(cbs, group, &c1) ||
      !scalar_from_cbs(cbs, group, &u0) || !scalar_from_cbs(cbs, group, &u1) ||
      !scalar_from_cbs(cbs, group, &v0) || !scalar_from_cbs(cbs, group, &v1)) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_DECODE_FAILURE);
    return 0;
  }

  EC_JACOBIAN pub0, pub1;
  ec_affine_to_jacobian(group, &pub0, &pub->pub0);
  ec_affine_to_jacobian(group, &pub1, &pub->pub1);
  EC_SCALAR minus_c0, minus_c1;
  ec_scalar_neg(group, &minus_c0, &c0);
  ec_scalar_neg(group, &minus_c1, &c1);
  if (  // K0 = u0*(G;T) + v0*(H;S) - c0*(pub0;W)
      !mul_public_3(group, &jacobians[idx_K00], g, &u0, &method->h, &v0, &pub0,
                    &minus_c0) ||
      !mul_public_3(group, &jacobians[idx_K01], T, &u0, S, &v0, W, &minus_c0) ||
      // K1 = u1*(G;T) + v1*(H;S) - c1*(pub1;W)
      !mul_public_3(group, &jacobians[idx_K10], g, &u1, &method->h, &v1, &pub1,
                    &minus_c1) ||
      !mul_public_3(group, &jacobians[idx_K11], T, &u1, S, &v1, W, &minus_c1)) {
    return 0;
  }

  EC_AFFINE affines[num_idx];
  jacobians[idx_T] = *T;
  jacobians[idx_S] = *S;
  jacobians[idx_W] = *W;
  jacobians[idx_Ws] = *Ws;
  if (!ec_jacobian_to_affine_batch(group, affines, jacobians, num_idx)) {
    return 0;
  }

  // Check the DLEQ proof.
  EC_SCALAR calculated;
  if (!hash_c_dleq(method, &calculated, &pub->pubs, &affines[idx_T],
                   &affines[idx_S], &affines[idx_Ws], &affines[idx_Ks0],
                   &affines[idx_Ks1])) {
    return 0;
  }

  // cs == calculated
  if (!ec_scalar_equal_vartime(group, &cs, &calculated)) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_INVALID_PROOF);
    return 0;
  }

  // Check the DLEQOR proof.
  if (!hash_c_dleqor(method, &calculated, &pub->pub0, &pub->pub1,
                     &affines[idx_T], &affines[idx_S], &affines[idx_W],
                     &affines[idx_K00], &affines[idx_K01], &affines[idx_K10],
                     &affines[idx_K11])) {
    return 0;
  }

  // c0 + c1 == calculated
  EC_SCALAR c;
  ec_scalar_add(group, &c, &c0, &c1);
  if (!ec_scalar_equal_vartime(group, &c, &calculated)) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_INVALID_PROOF);
    return 0;
  }

  return 1;
}